

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall dmlc::JSONWriter::WriteSeperator(JSONWriter *this)

{
  ostream *poVar1;
  reference rVar2;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if ((((long)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
       (long)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
       (ulong)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) &&
     (rVar2 = std::vector<bool,_std::allocator<bool>_>::back(&this->scope_multi_line_),
     (*rVar2._M_p & rVar2._M_mask) == 0)) {
    return;
  }
  std::operator<<(this->os_,'\n');
  poVar1 = this->os_;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct
            ((ulong)local_30,
             ((char)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (char)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * '\x10' +
             (char)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset * '\x02');
  std::operator<<(poVar1,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

inline void JSONWriter::WriteSeperator() {
  if (scope_multi_line_.size() == 0 || scope_multi_line_.back()) {
    Extend(os_, '\n');
    Extend(os_, std::string(scope_multi_line_.size() * 2, ' '));
  }
}